

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strspn.c
# Opt level: O3

size_t strspn(char *__s,char *__accept)

{
  size_t sVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  
  cVar2 = *__s;
  if (cVar2 == '\0') {
LAB_00101162:
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      pcVar3 = __accept + 1;
      cVar4 = *__accept;
      if (*__accept == '\0') goto LAB_00101162;
      while (cVar2 != cVar4) {
        cVar4 = *pcVar3;
        pcVar3 = pcVar3 + 1;
        if (cVar4 == '\0') {
          return sVar1;
        }
      }
      cVar2 = __s[sVar1 + 1];
      sVar1 = sVar1 + 1;
    } while (cVar2 != '\0');
  }
  return sVar1;
}

Assistant:

size_t strspn( const char * s1, const char * s2 )
{
    size_t len = 0;
    const char * p;

    while ( s1[ len ] )
    {
        p = s2;

        while ( *p )
        {
            if ( s1[len] == *p )
            {
                break;
            }

            ++p;
        }

        if ( ! *p )
        {
            return len;
        }

        ++len;
    }

    return len;
}